

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tzx.cpp
# Opt level: O3

void TZX_AppendStandardBlock(path *fname,byte *buf,aint buflen,word pauseAfterMs,byte sync)

{
  pointer pcVar1;
  FILE *__stream;
  ulong uVar2;
  uint __c;
  long *local_50 [2];
  long local_40 [2];
  
  __stream = (FILE *)SJ_fopen(fname,"a+b");
  if (__stream == (FILE *)0x0) {
    pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
    Error("[TZX] Error opening file for append",(char *)local_50[0],FATAL);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  fputc(0x10,__stream);
  fputc(pauseAfterMs & 0xff,__stream);
  fputc((uint)(pauseAfterMs >> 8),__stream);
  fputc(buflen + 2U & 0xff,__stream);
  fputc((int)(buflen + 2U) >> 8,__stream);
  __c = (uint)sync;
  fputc((uint)sync,__stream);
  fwrite(buf,1,(long)buflen,__stream);
  if (0 < buflen) {
    uVar2 = 0;
    do {
      sync = sync ^ buf[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)buflen != uVar2);
    __c = (uint)sync;
  }
  fputc(__c,__stream);
  fclose(__stream);
  return;
}

Assistant:

void TZX_AppendStandardBlock(const std::filesystem::path & fname,
							 const byte* buf, const aint buflen, word pauseAfterMs, byte sync) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "a+b")) {
		Error("[TZX] Error opening file for append", fname.string().c_str(), FATAL);
	}

	const aint totalDataLen = buflen + 2; // + sync byte + checksum

	fputc(TZXBlockId::Standard, ff); // block id

	fputc(pauseAfterMs & 0xFF, ff); // block header
	fputc(pauseAfterMs >> 8, ff);
	fputc(totalDataLen & 0xFF, ff);
	fputc(totalDataLen >> 8, ff);

	fputc(sync, ff); // sync pattern
	fwrite(buf, 1, buflen, ff); // payload
	byte check = sync;
	for (aint i = 0; i < buflen; ++i) check ^= buf[i];
	fputc(check, ff); // checksum
	fclose(ff);
}